

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  int iVar1;
  uint32_t *puVar2;
  uint *local_158;
  uint32_t *SK;
  uint32_t *RK;
  mbedtls_aes_context cty;
  int ret;
  int j;
  int i;
  uint keybits_local;
  uchar *key_local;
  mbedtls_aes_context *ctx_local;
  
  mbedtls_aes_init((mbedtls_aes_context *)&RK);
  ctx->rk = ctx->buf;
  cty.buf[0x42] = mbedtls_aes_setkey_enc((mbedtls_aes_context *)&RK,key,keybits);
  if (cty.buf[0x42] == 0) {
    ctx->nr = (int)RK;
    iVar1 = mbedtls_aesni_has_support(0x2000000);
    if (iVar1 == 0) {
      puVar2 = (uint32_t *)(cty._0_8_ + (long)((int)RK << 2) * 4);
      ctx->buf[0] = *puVar2;
      ctx->buf[1] = puVar2[1];
      ctx->buf[2] = puVar2[2];
      SK = ctx->buf + 4;
      ctx->buf[3] = puVar2[3];
      ret = ctx->nr;
      local_158 = puVar2 + -4;
      while (ret = ret + -1, 0 < ret) {
        for (cty.buf[0x43] = 0; (int)cty.buf[0x43] < 4; cty.buf[0x43] = cty.buf[0x43] + 1) {
          *SK = RT0[FSb[*local_158 & 0xff]] ^ RT1[FSb[*local_158 >> 8 & 0xff]] ^
                RT2[FSb[*local_158 >> 0x10 & 0xff]] ^ RT3[FSb[*local_158 >> 0x18]];
          local_158 = local_158 + 1;
          SK = SK + 1;
        }
        local_158 = local_158 + -8;
      }
      *SK = *local_158;
      SK[1] = local_158[1];
      SK[2] = local_158[2];
      SK[3] = local_158[3];
    }
    else {
      mbedtls_aesni_inverse_key((uchar *)ctx->rk,(uchar *)cty._0_8_,ctx->nr);
    }
  }
  mbedtls_aes_free((mbedtls_aes_context *)&RK);
  return cty.buf[0x42];
}

Assistant:

int mbedtls_aes_setkey_dec( mbedtls_aes_context *ctx, const unsigned char *key,
                    unsigned int keybits )
{
    int i, j, ret;
    mbedtls_aes_context cty;
    uint32_t *RK;
    uint32_t *SK;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( key != NULL );

    mbedtls_aes_init( &cty );

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_PADLOCK_ALIGN16)
    if( aes_padlock_ace == -1 )
        aes_padlock_ace = mbedtls_padlock_has_support( MBEDTLS_PADLOCK_ACE );

    if( aes_padlock_ace )
        ctx->rk = RK = MBEDTLS_PADLOCK_ALIGN16( ctx->buf );
    else
#endif
    ctx->rk = RK = ctx->buf;

    /* Also checks keybits */
    if( ( ret = mbedtls_aes_setkey_enc( &cty, key, keybits ) ) != 0 )
        goto exit;

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_AES ) )
    {
        mbedtls_aesni_inverse_key( (unsigned char *) ctx->rk,
                           (const unsigned char *) cty.rk, ctx->nr );
        goto exit;
    }
#endif

    SK = cty.rk + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

    for( i = ctx->nr - 1, SK -= 8; i > 0; i--, SK -= 8 )
    {
        for( j = 0; j < 4; j++, SK++ )
        {
            *RK++ = AES_RT0( FSb[ ( *SK       ) & 0xFF ] ) ^
                    AES_RT1( FSb[ ( *SK >>  8 ) & 0xFF ] ) ^
                    AES_RT2( FSb[ ( *SK >> 16 ) & 0xFF ] ) ^
                    AES_RT3( FSb[ ( *SK >> 24 ) & 0xFF ] );
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

exit:
    mbedtls_aes_free( &cty );

    return( ret );
}